

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzlib.c
# Opt level: O3

char * gzerror(gzFile file,int *errnum)

{
  char *pcVar1;
  
  if ((file != (gzFile)0x0) && ((*file == 0x79b1 || (*file == 0x1c4f)))) {
    if (errnum != (int *)0x0) {
      *errnum = *(int *)((long)file + 0x6c);
    }
    pcVar1 = "";
    if (*(char **)((long)file + 0x70) != (char *)0x0) {
      pcVar1 = *(char **)((long)file + 0x70);
    }
    return pcVar1;
  }
  return (char *)0x0;
}

Assistant:

const char * ZEXPORT gzerror(gzFile file, int *errnum)
{
    gz_statep state;

    /* get internal structure and check integrity */
    if (file == NULL)
        return NULL;
    state = (gz_statep)file;
    if (state->mode != GZ_READ && state->mode != GZ_WRITE)
        return NULL;

    /* return error information */
    if (errnum != NULL)
        *errnum = state->err;
    return state->msg == NULL ? "" : state->msg;
}